

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MemPool.cpp
# Opt level: O0

void amrex_array_init_snan(Real *p,size_t nelems)

{
  size_t i;
  uint64_t snan;
  size_t nelems_local;
  Real *p_local;
  
  p_local = p;
  for (i = 0; i < nelems; i = i + 1) {
    *p_local = NAN;
    p_local = p_local + 1;
  }
  return;
}

Assistant:

void amrex_array_init_snan (Real* p, size_t nelems)
{
#ifdef BL_USE_DOUBLE

#ifdef UINT64_MAX
    const uint64_t snan = UINT64_C(0x7ff0000080000001);
    static_assert(sizeof(double) == sizeof(uint64_t), "MemPool: sizeof double != sizeof uint64_t");
    for (size_t i = 0; i < nelems; ++i) {
        std::memcpy(p++, &snan, sizeof(double));
    }
#endif

#else

#ifdef UINT32_MAX
    const uint32_t snan = UINT32_C(0x7fa00000);
    static_assert(sizeof(float) == sizeof(uint32_t), "MemPool: sizeof float != sizeof uint32_t");
    for (size_t i = 0; i < nelems; ++i) {
        std::memcpy(p++, &snan, sizeof(float));
    }
#endif

#endif
}